

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O1

PsocksDataSink * pds_stdio(FILE **fp)

{
  stdio_sink *psVar1;
  size_t i;
  long lVar2;
  stdio_sink *sink;
  
  lVar2 = 0;
  psVar1 = (stdio_sink *)safemalloc(1,0x58,0);
  sink = psVar1;
  do {
    setvbuf((FILE *)fp[lVar2],(char *)0x0,2,0);
    stdio_sink_init(sink,fp[lVar2]);
    (&psVar1[2].binarysink_[0].write)[lVar2] =
         (_func_void_BinarySink_ptr_void_ptr_size_t *)sink->binarysink_;
    lVar2 = lVar2 + 1;
    sink = sink + 1;
  } while (lVar2 == 1);
  psVar1[2].fp = (FILE *)stdio_free;
  return (PsocksDataSink *)(psVar1 + 2);
}

Assistant:

PsocksDataSink *pds_stdio(FILE *fp[2])
{
    PsocksDataSinkStdio *pdss = snew(PsocksDataSinkStdio);

    for (size_t i = 0; i < 2; i++) {
        setvbuf(fp[i], NULL, _IONBF, 0);
        stdio_sink_init(&pdss->sink[i], fp[i]);
        pdss->pds.s[i] = BinarySink_UPCAST(&pdss->sink[i]);
    }

    pdss->pds.free = stdio_free;

    return &pdss->pds;
}